

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.cpp
# Opt level: O0

void * Tests::FindVar(char *name)

{
  int iVar1;
  uint local_1c;
  uint i;
  char *name_local;
  
  local_1c = 0;
  while( true ) {
    if (variableCount <= local_1c) {
      return (void *)0x0;
    }
    iVar1 = strcmp(name,(char *)(symbols + (ulong)*(uint *)(varInfo + (ulong)local_1c * 0x10)));
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return (void *)(varData + (ulong)*(uint *)(varInfo + (ulong)local_1c * 0x10 + 0xc));
}

Assistant:

void* Tests::FindVar(const char* name)
{
	for(unsigned int i = 0; i < variableCount; i++)
	{
		if(strcmp(name, symbols + varInfo[i].offsetToName) == 0)
			return (void*)(varData + varInfo[i].offset);
	}
	return NULL;
}